

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Latency_Coding_Encode_Decode_Results.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  time_t tVar2;
  Clock *this;
  Parameters *param;
  Population *this_00;
  Population *this_01;
  Population *this_02;
  LatencyEncodingSynapse_param *param_00;
  LatencyEncodingSynapse *this_03;
  LatencyDecodingSynapse_param *param_01;
  LatencyDecodingSynapse *this_04;
  Network_param *param_02;
  ostream *poVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  string local_d8;
  string local_b8;
  string local_98;
  Network n;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  local_e0 = 0.0;
  if (argc < 10) {
    local_120 = 0.0001;
    local_128 = 0.1;
    local_e8 = 1.0;
    uVar4 = 0;
    uVar5 = 0;
    local_f0 = 0.0;
    local_f8 = 0.0;
    local_100 = 0.0;
    local_108 = 0.0;
    local_110 = 0.0;
    local_118 = 0.0;
  }
  else {
    local_e8 = atof(argv[1]);
    local_f0 = atof(argv[2]);
    local_f8 = atof(argv[3]);
    local_100 = atof(argv[4]);
    local_108 = atof(argv[5]);
    local_110 = atof(argv[6]);
    local_118 = atof(argv[7]);
    local_128 = atof(argv[8]);
    local_120 = atof(argv[9]);
    if (argc == 0xc) {
      local_e0 = atof(argv[10]);
      dVar1 = atof(argv[0xb]);
      uVar4 = SUB84(dVar1,0);
      uVar5 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    else {
      uVar4 = 0;
      uVar5 = 0;
    }
  }
  this = Clock::getInstance();
  Clock::setDt(this,local_120);
  param = (Parameters *)operator_new(0x58);
  *(double *)param = local_e8;
  *(double *)(param + 8) = local_f0;
  *(double *)(param + 0x10) = local_f8;
  *(double *)(param + 0x18) = local_100;
  *(double *)(param + 0x20) = local_108;
  *(double *)(param + 0x28) = local_110;
  *(double *)(param + 0x30) = local_118;
  *(undefined8 *)(param + 0x38) = 0x3fb0000000000000;
  *(undefined8 *)(param + 0x40) = 0x3fe0000000000000;
  *(double *)(param + 0x48) = local_e0;
  *(ulong *)(param + 0x50) = CONCAT44(uVar5,uVar4);
  this_00 = (Population *)operator_new(0x60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"SignalGenerator",(allocator<char> *)&n);
  Population::Population(this_00,1,&local_98,param);
  std::__cxx11::string::~string((string *)&local_98);
  this_01 = (Population *)operator_new(0x60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"PassThrough",(allocator<char> *)&n);
  Population::Population(this_01,1,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  this_02 = (Population *)operator_new(0x60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"PassThrough",(allocator<char> *)&n);
  Population::Population(this_02,1,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  param_00 = (LatencyEncodingSynapse_param *)operator_new(8);
  param_00->window_length_s = local_128;
  this_03 = (LatencyEncodingSynapse *)operator_new(0x68);
  LatencyEncodingSynapse::LatencyEncodingSynapse(this_03,this_00,this_01,param_00);
  param_01 = (LatencyDecodingSynapse_param *)operator_new(0x10);
  param_01->delay_s = 0.0;
  param_01->window_length_s = local_128;
  this_04 = (LatencyDecodingSynapse *)operator_new(0x68);
  LatencyDecodingSynapse::LatencyDecodingSynapse(this_04,this_01,this_02,param_01);
  param_02 = (Network_param *)operator_new(8);
  param_02->dt = local_120;
  Network::Network(&n,param_02);
  Network::add(&n,(Synapse *)this_03);
  Network::add(&n,(Synapse *)this_04);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar3);
  Network::run(&n,1.0);
  Network::~Network(&n);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) 
{
    srand(time(NULL));

    // Command line arguments
    double sine1 = 1;
    double sine2 = 0;
    double sine3 = 0;
    double sine4 = 0;
    double sine5 = 0;
    double sine6 = 0;
    double sine7 = 0;
    double window_length_s = 0.1;
    double dt = 0.0001;
    double mean = 0;
    double variance = 0;
    if(argc >= 10) {
        sine1 = atof(argv[1]);
        sine2 = atof(argv[2]);
        sine3 = atof(argv[3]);
        sine4 = atof(argv[4]);
        sine5 = atof(argv[5]);
        sine6 = atof(argv[6]);
        sine7 = atof(argv[7]);
        window_length_s = atof(argv[8]);
        dt = atof(argv[9]);
    }
    if(argc == 12) {
        mean = atof(argv[10]);
        variance = atof(argv[11]);
    }
    // ----------------------

    Clock::getInstance()->setDt(dt);

    // Populations
    SignalGenerator_param* paramp1 = new SignalGenerator_param();
    paramp1->f1 = sine1;
    paramp1->f2 = sine2;
    paramp1->f3 = sine3;
    paramp1->f4 = sine4;
    paramp1->f5 = sine5;
    paramp1->f6 = sine6;
    paramp1->f7 = sine7;
    paramp1->scale = 1/16.0;
    paramp1->offset = 0.5;
    paramp1->noiseMean = mean;
    paramp1->noiseStd = variance;
    Population* p1 = new Population(1, "SignalGenerator", paramp1);

    Population* p3 = new Population(1, "PassThrough");
    Population* p4 = new Population(1, "PassThrough");

    // Synapses
    LatencyEncodingSynapse_param* params1 = new LatencyEncodingSynapse_param();
    params1->window_length_s = window_length_s;
    LatencyEncodingSynapse* s1 = new LatencyEncodingSynapse(p1, p3, params1);

    LatencyDecodingSynapse_param* params2 = new LatencyDecodingSynapse_param();
    params2->window_length_s = window_length_s;
    LatencyDecodingSynapse* s2 = new LatencyDecodingSynapse(p3, p4, params2);

    // Create the network
    Network_param* n_param = new Network_param();
    n_param->dt = dt;
    Network n = Network(n_param);

    // Add the synapse to the network
    n.add(s1);
    n.add(s2);

    cout << (long)s2 << endl;
    cout << (long)s1 << endl;

    // Run the network for 100 second
    n.run(1.0);
    
    return 0;
}